

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry.cpp
# Opt level: O3

void __thiscall
duckdb::CatalogEntry::SetChild
          (CatalogEntry *this,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *child_p
          )

{
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var1;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var2;
  pointer pCVar3;
  
  _Var2._M_head_impl =
       (child_p->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (child_p->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t
  .super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  _Var1._M_head_impl =
       (this->child).
       super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (this->child).super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (CatalogEntry *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_CatalogEntry + 8))();
    _Var2._M_head_impl =
         (this->child).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  }
  if (_Var2._M_head_impl != (CatalogEntry *)0x0) {
    pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
             operator->(&this->child);
    (pCVar3->parent).ptr = this;
  }
  return;
}

Assistant:

void CatalogEntry::SetChild(unique_ptr<CatalogEntry> child_p) {
	child = std::move(child_p);
	if (child) {
		child->parent = this;
	}
}